

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O0

void test_delimiters_6(void)

{
  char *in_stack_00000590;
  char *in_stack_00000598;
  char *in_stack_000005a0;
  char *in_stack_000005a8;
  char *in_stack_000005b0;
  
  run(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  return;
}

Assistant:

static void
test_delimiters_6(void)
{
    run(
        "delimiters set in a partial should not affect the parent template",
        "[ {{>include}} ]\n[ .{{value}}.  .|value|. ]\n",
        "{\"value\": \"yes\"}",
        "{\"include\": \".{{value}}. {{= | | =}} .|value|.\"}",
        "[ .yes.  .yes. ]\n[ .yes.  .|value|. ]\n"
    );
}